

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t archive_test_acl_match
                  (archive_test_acl_t *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t qual,
                  char *name)

{
  int iVar1;
  char *name_local;
  wchar_t qual_local;
  wchar_t tag_local;
  wchar_t permset_local;
  wchar_t type_local;
  archive_test_acl_t *acl_local;
  
  if (type == acl->type) {
    if (permset == acl->permset) {
      if (tag == acl->tag) {
        if (tag == L'✒') {
          acl_local._4_4_ = L'\x01';
        }
        else if (tag == L'✔') {
          acl_local._4_4_ = L'\x01';
        }
        else if (tag == L'❻') {
          acl_local._4_4_ = L'\x01';
        }
        else if (tag == L'✖') {
          acl_local._4_4_ = L'\x01';
        }
        else if (qual == acl->qual) {
          if (name == (char *)0x0) {
            if ((acl->name == (char *)0x0) || (*acl->name == '\0')) {
              acl_local._4_4_ = L'\x01';
            }
            else {
              acl_local._4_4_ = L'\0';
            }
          }
          else if (acl->name == (char *)0x0) {
            if (*name == '\0') {
              acl_local._4_4_ = L'\x01';
            }
            else {
              acl_local._4_4_ = L'\0';
            }
          }
          else {
            iVar1 = strcmp(name,acl->name);
            acl_local._4_4_ = (wchar_t)(iVar1 == 0);
          }
        }
        else {
          acl_local._4_4_ = L'\0';
        }
      }
      else {
        acl_local._4_4_ = L'\0';
      }
    }
    else {
      acl_local._4_4_ = L'\0';
    }
  }
  else {
    acl_local._4_4_ = L'\0';
  }
  return acl_local._4_4_;
}

Assistant:

static int
archive_test_acl_match(struct archive_test_acl_t *acl, int type, int permset,
    int tag, int qual, const char *name)
{
	if (type != acl->type)
		return (0);
	if (permset != acl->permset)
		return (0);
	if (tag != acl->tag)
		return (0);
	if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
		return (1);
	if (tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ)
		return (1);
	if (tag == ARCHIVE_ENTRY_ACL_EVERYONE)
		return (1);
	if (tag == ARCHIVE_ENTRY_ACL_OTHER)
		return (1);
	if (qual != acl->qual)
		return (0);
	if (name == NULL) {
		if (acl->name == NULL || acl->name[0] == '\0')
			return (1);
		return (0);
	}
	if (acl->name == NULL) {
		if (name[0] == '\0')
			return (1);
		return (0);
	}
	return (0 == strcmp(name, acl->name));
}